

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleInterpolationTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::pipeline::multisample::
MSInstance<vkt::pipeline::multisample::MSInstanceInterpolateScreenPosition>::verifyImageData
          (TestStatus *__return_storage_ptr__,
          MSInstance<vkt::pipeline::multisample::MSInstanceInterpolateScreenPosition> *this,
          VkImageCreateInfo *imageRSInfo,ConstPixelBufferAccess *dataRS)

{
  bool bVar1;
  long *local_30;
  long local_28;
  long local_20 [2];
  
  bVar1 = checkForError(imageRSInfo,dataRS,0);
  local_30 = local_20;
  if (bVar1) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"Failed","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,local_30,local_28 + (long)local_30);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"Passed","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,local_30,local_28 + (long)local_30);
  }
  if (local_30 != local_20) {
    operator_delete(local_30,local_20[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus MSInstance<MSInstanceInterpolateScreenPosition>::verifyImageData (const vk::VkImageCreateInfo& imageRSInfo, const tcu::ConstPixelBufferAccess& dataRS) const
{
	if (checkForError(imageRSInfo, dataRS, 0))
		return tcu::TestStatus::fail("Failed");

	return tcu::TestStatus::pass("Passed");
}